

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue.cpp
# Opt level: O2

void __thiscall libcellml::Issue::Issue(Issue *this)

{
  IssueImpl *this_00;
  
  this->_vptr_Issue = (_func_int **)&PTR__Issue_0029ffb0;
  this_00 = (IssueImpl *)operator_new(0x38);
  (this_00->mDescription)._M_dataplus._M_p = (pointer)0x0;
  (this_00->mDescription)._M_string_length = 0;
  (this_00->mDescription).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->mDescription).field_2 + 8) = 0;
  this_00->mLevel = ERROR;
  this_00->mReferenceRule = UNDEFINED;
  (this_00->mItem).super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_00->mItem).super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  IssueImpl::IssueImpl(this_00);
  this->mPimpl = this_00;
  return;
}

Assistant:

Issue::Issue()
    : mPimpl(new IssueImpl())
{
}